

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::_InternalParse
          (RandomUniformStaticLayerParams *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  uint64_t value;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *ptr_00;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  float *local_40;
  InternalMetadata *local_38;
  
  local_40 = (float *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar2) {
    local_38 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_40;
      uVar5 = (uint)bVar1;
      ptr_00 = (float *)((long)local_40 + 1);
      if ((char)bVar1 < '\0') {
        uVar5 = ((uint)bVar1 + (uint)*(byte *)ptr_00 * 0x80) - 0x80;
        if ((char)*(byte *)ptr_00 < '\0') {
          pVar6 = google::protobuf::internal::ReadTagFallback((char *)local_40,uVar5);
          ptr_00 = (float *)pVar6.first;
          uVar5 = pVar6.second;
        }
        else {
          ptr_00 = (float *)((long)local_40 + 2);
        }
      }
      cVar4 = (char)uVar5;
      local_40 = ptr_00;
      switch(uVar5 >> 3) {
      case 1:
        if (cVar4 != '\b') break;
        uVar3 = (ulong)(char)*(byte *)ptr_00;
        local_40 = (float *)((long)ptr_00 + 1);
        if ((long)uVar3 < 0) {
          uVar5 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)ptr_00) - 0x80;
          if ((char)*(byte *)local_40 < '\0') {
            local_40 = ptr_00;
            pVar7 = google::protobuf::internal::VarintParseSlow64((char *)ptr_00,uVar5);
            local_40 = (float *)pVar7.first;
            this->seed_ = pVar7.second;
            goto joined_r0x0028e698;
          }
          uVar3 = (ulong)uVar5;
          local_40 = (float *)((long)ptr_00 + 2);
        }
        this->seed_ = uVar3;
        goto LAB_0028e6d7;
      case 2:
        if (cVar4 == '\x15') {
          this->minval_ = *ptr_00;
LAB_0028e658:
          local_40 = ptr_00 + 1;
          goto LAB_0028e6d7;
        }
        break;
      case 3:
        if (cVar4 == '\x1d') {
          this->maxval_ = *ptr_00;
          goto LAB_0028e658;
        }
        break;
      case 4:
        if (cVar4 == '\"') {
          local_40 = (float *)google::protobuf::internal::PackedUInt64Parser
                                        (&this->outputshape_,(char *)ptr_00,ctx);
        }
        else {
          if ((uVar5 & 0xff) != 0x20) break;
          value = google::protobuf::internal::ReadVarint64((char **)&local_40);
          _internal_add_outputshape(this,value);
        }
        goto joined_r0x0028e698;
      }
      if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
        if (ptr_00 == (float *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
        return (char *)ptr_00;
      }
      if ((local_38->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(local_38);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((local_38->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_40 = (float *)google::protobuf::internal::UnknownFieldParse
                                    (uVar5,unknown,(char *)local_40,ctx);
joined_r0x0028e698:
      if (local_40 == (float *)0x0) {
        return (char *)0x0;
      }
LAB_0028e6d7:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_40;
}

Assistant:

const char* RandomUniformStaticLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // int64 seed = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          seed_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // float minVal = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 21)) {
          minval_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // float maxVal = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 29)) {
          maxval_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // repeated uint64 outputShape = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedUInt64Parser(_internal_mutable_outputshape(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 32) {
          _internal_add_outputshape(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}